

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

Result __thiscall tonk::gateway::ParsedURL::Parse(ParsedURL *this,string *url)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string *desc;
  string *in_RDX;
  string *in_RSI;
  ErrorResult *in_RDI;
  error_code ec;
  string ip;
  string portStr;
  int port;
  string path;
  size_t portEnd;
  size_t portStart;
  size_t slash;
  size_t ipEnd;
  address *in_stack_fffffffffffffdd8;
  ErrorResult *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  ErrorResult *pEVar5;
  error_code *this_00;
  ErrorResult *in_stack_fffffffffffffe00;
  string local_1a0 [64];
  error_code local_160;
  string local_150 [32];
  uint local_130;
  allocator local_129;
  string local_128 [32];
  string local_108 [48];
  string local_d8 [36];
  int local_b4;
  string local_b0 [32];
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  string *local_70;
  string *local_48;
  long local_28;
  undefined4 local_1c;
  string *local_18;
  char *local_10;
  
  local_70 = in_RDX;
  std::__cxx11::string::operator=(in_RSI,in_RDX);
  local_88 = std::__cxx11::string::find((char)local_70,0x3a);
  if (local_88 == 0xffffffffffffffff) {
    local_78 = std::__cxx11::string::length();
    local_80 = 0xffffffffffffffff;
    uVar1 = local_88;
  }
  else {
    local_80 = local_88 + 1;
    uVar1 = local_80;
    local_78 = local_88;
  }
  local_88 = uVar1;
  std::__cxx11::string::string(local_b0);
  local_90 = std::__cxx11::string::find((char)local_70,0x2f);
  local_80 = local_90;
  if (local_90 == 0xffffffffffffffff) {
    local_90 = std::__cxx11::string::length();
    std::__cxx11::string::clear();
  }
  else {
    if (local_90 < local_78) {
      local_78 = local_90;
    }
    std::__cxx11::string::substr((ulong)local_d8,(ulong)local_70);
    std::__cxx11::string::operator=(local_b0,local_d8);
    std::__cxx11::string::~string(local_d8);
  }
  if (local_88 == 0xffffffffffffffff) {
    local_b4 = 0x50;
  }
  else {
    std::__cxx11::string::substr((ulong)local_108,(ulong)local_70);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_b4 = atoi(pcVar4);
    bVar2 = local_b4 < 1;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"Port did not parse",&local_129);
      local_48 = local_128;
      pcVar4 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult(in_stack_fffffffffffffde0,(string *)in_stack_fffffffffffffdd8);
      in_RDI->Source = pcVar4;
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
    }
    local_130 = (uint)bVar2;
    std::__cxx11::string::~string(local_108);
    if (local_130 != 0) goto LAB_0019a6a4;
  }
  if (local_b4 == 0x1bb) {
    local_b4 = 0x50;
  }
  std::__cxx11::string::substr((ulong)local_150,(ulong)local_70);
  std::__cxx11::string::operator=(in_RSI + 0x40,local_150);
  *(undefined2 *)(in_RSI + 0x60) = (undefined2)local_b4;
  std::__cxx11::string::operator=(in_RSI + 0x20,local_b0);
  this_00 = &local_160;
  std::error_code::error_code((error_code *)in_stack_fffffffffffffde0);
  asio::ip::make_address(in_stack_fffffffffffffde8,(error_code *)in_stack_fffffffffffffde0);
  asio::ip::address::operator=((address *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  bVar2 = std::error_code::operator_cast_to_bool(&local_160);
  if (bVar2) {
    std::error_code::message_abi_cxx11_(this_00);
    iVar3 = std::error_code::value(&local_160);
    local_28 = (long)iVar3;
    local_10 = "retrieveDescription: Invalid IP string";
    local_18 = local_1a0;
    local_1c = 2;
    pEVar5 = in_RDI;
    desc = (string *)operator_new(0x38);
    ErrorResult::ErrorResult
              (in_stack_fffffffffffffe00,(char *)this_00,desc,(ErrorType)((ulong)pEVar5 >> 0x20),
               (ErrorCodeT)in_stack_fffffffffffffde0);
    pEVar5->Source = (char *)desc;
    std::__cxx11::string::~string(local_1a0);
  }
  else {
    asio::ip::basic_endpoint<asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<asio::ip::tcp> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               0);
    asio::ip::basic_endpoint<asio::ip::tcp>::operator=
              ((basic_endpoint<asio::ip::tcp> *)in_stack_fffffffffffffde0,
               (basic_endpoint<asio::ip::tcp> *)in_stack_fffffffffffffdd8);
    Result::Success();
  }
  local_130 = 1;
  std::__cxx11::string::~string(local_150);
LAB_0019a6a4:
  std::__cxx11::string::~string(local_b0);
  return (Result)in_RDI;
}

Assistant:

Result ParsedURL::Parse(const std::string& url)
{
    FullURL = url;

    size_t ipEnd, slash;

    // Find port offset
    size_t portStart = url.find(':');
    if (portStart == std::string::npos) {
        ipEnd = url.length();
        slash = std::string::npos;
    }
    else {
        ipEnd = portStart;
        ++portStart;
        slash = portStart;
    }

    size_t portEnd;
    std::string path;
    int port;

    // Find path offset relative to port
    slash = url.find('/', slash);
    if (slash == std::string::npos) {
        portEnd = url.length();
        path.clear();
    }
    else {
        portEnd = slash;
        if (ipEnd > slash) {
            ipEnd = slash;
        }
        path = url.substr(slash + 1);
    }

    // Parse out port field
    if (portStart == std::string::npos) {
        port = 80; // Default HTTP port
    }
    else {
        const std::string portStr = url.substr(portStart, portEnd - portStart);
        port = atoi(portStr.c_str());
        if (port <= 0) {
            return Result("Port did not parse");
        }
    }

    // Note that regardless of protocol we always connect on port 80 with
    // HTTP (no SSL encryption) unless a port is specified in the URL
    if (port == 443) {
        // Force port 80 instead of HTTPS since we do not support encryption
        port = 80;
    }

    // Parse out IP field
    std::string ip = url.substr(0, ipEnd);

    // Fill info
    IP = ip;
    Port = (uint16_t)port;
    XMLPath = path;

    asio::error_code ec;

    // Convert IP string to IP address
    IPAddr = asio::ip::make_address(ip, ec);

    if (ec) {
        return Result("retrieveDescription: Invalid IP string", ec.message(), ErrorType::Asio, ec.value());
    }

    TCPEndpoint = asio::ip::tcp::endpoint(IPAddr, Port);

    return Result::Success();
}